

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

uint AddAsciiString(TidyPrintImpl *pprint,ctmbstr str,uint string_index)

{
  uint uVar1;
  uint local_20;
  uint len;
  uint ix;
  uint string_index_local;
  ctmbstr str_local;
  TidyPrintImpl *pprint_local;
  
  uVar1 = prvTidytmbstrlen(str);
  if (pprint->lbufsize <= string_index + uVar1) {
    expand(pprint,string_index + uVar1);
  }
  for (local_20 = 0; local_20 < uVar1; local_20 = local_20 + 1) {
    pprint->linebuf[string_index + local_20] = (int)str[local_20];
  }
  return string_index + uVar1;
}

Assistant:

static uint AddAsciiString( TidyPrintImpl* pprint, ctmbstr str, uint string_index )
{
    uint ix, len = TY_(tmbstrlen)( str );
    if ( string_index + len >= pprint->lbufsize )
        expand( pprint, string_index + len );

    for ( ix=0; ix<len; ++ix )
        pprint->linebuf[string_index + ix] = str[ ix ];
    return string_index + len;
}